

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void autocovar_fft(auto_fft_object obj,double *vec,double *acov,int M)

{
  uint uVar1;
  uint uVar2;
  double *inp;
  double *oup;
  fft_data *oup_00;
  fft_data *inp_00;
  ulong uVar3;
  size_t sVar4;
  size_t __size;
  double dVar5;
  double dVar6;
  uint local_34;
  
  uVar1 = obj->ilen;
  uVar2 = obj->clen;
  if ((int)uVar2 < M) {
    local_34 = uVar2 - 1;
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
  }
  else {
    local_34 = 0;
    if (0 < M) {
      local_34 = M;
    }
  }
  __size = (long)(int)uVar2 << 4;
  inp = (double *)malloc(__size);
  oup = (double *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  inp_00 = (fft_data *)malloc(__size);
  dVar5 = 0.0;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      dVar5 = dVar5 + vec[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if ((int)uVar2 < 1) {
    fft_r2c_exec(obj->fobj,inp,oup_00);
  }
  else {
    uVar3 = 0;
    do {
      dVar6 = 0.0;
      if ((long)uVar3 < (long)(int)uVar1) {
        dVar6 = vec[uVar3] - dVar5 / (double)(int)uVar1;
      }
      inp[uVar3] = dVar6;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    fft_r2c_exec(obj->fobj,inp,oup_00);
    if (0 < (int)uVar2) {
      sVar4 = 0;
      do {
        dVar5 = *(double *)((long)&oup_00->re + sVar4);
        dVar6 = *(double *)((long)&oup_00->im + sVar4);
        *(double *)((long)&inp_00->re + sVar4) = dVar5 * dVar5 + dVar6 * dVar6;
        *(undefined8 *)((long)&inp_00->im + sVar4) = 0;
        sVar4 = sVar4 + 0x10;
      } while (__size != sVar4);
    }
  }
  fft_c2r_exec(obj->iobj,inp_00,oup);
  if (0 < (int)local_34) {
    uVar3 = 0;
    do {
      acov[uVar3] = oup[uVar3] / (double)(int)(uVar1 * uVar2);
      uVar3 = uVar3 + 1;
    } while (local_34 != uVar3);
  }
  free(inp);
  free(oup);
  free(oup_00);
  free(inp_00);
  return;
}

Assistant:

void autocovar_fft(auto_fft_object obj,double* vec,double* acov, int M) {
	int i,N,L,N2;
	double m;
	fft_type* a;
	fft_type* b;
	fft_data* ao;
	fft_data* bo;
	
	N = obj->clen;
	L = obj->ilen;
	N2 = N * L;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	
	a = (fft_type*) malloc (sizeof(fft_data) * N);
	b = (fft_type*) malloc (sizeof(fft_data) * N);
	ao = (fft_data*) malloc (sizeof(fft_data) * N);
	bo = (fft_data*) malloc (sizeof(fft_data) * N);
	
	m = mean(vec,L);
	
	for (i = 0; i < N;i++) {
		if (i < L) {
			a[i] = vec[i] - m;
		} else {
			a[i] = 0.0;
		}
	
	}
	
	fft_r2c_exec(obj->fobj,a,ao);
	
	for (i = 0; i < N;i++) {
		bo[i].re = ao[i].re * ao[i].re + ao[i].im * ao[i].im;
		bo[i].im = 0.0;
	}
	
	fft_c2r_exec(obj->iobj,bo,b);
	
	for (i = 0; i < M;i++) {
		acov[i] = b[i]/N2;
	}
	
	free(a);
	free(b);
	free(ao);
	free(bo);

}